

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::free_final_item(final_item *p)

{
  v_array<Search::scored_action>::delete_v(*(v_array<Search::scored_action> **)p);
  operator_delete(*(void **)p);
  std::__cxx11::string::~string((string *)(p + 8));
  operator_delete(p);
  return;
}

Assistant:

void free_final_item(final_item* p)
{
  p->prefix->delete_v();
  delete p->prefix;
  delete p;
}